

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::LogDestination::SetLogDestination(LogSeverity severity,char *base_filename)

{
  mutex *__mutex;
  string *__lhs;
  bool bVar1;
  LogDestination *pLVar2;
  undefined8 unaff_RBX;
  
  std::mutex::lock((mutex *)log_mutex);
  pLVar2 = log_destination((LogSeverity)((ulong)unaff_RBX >> 0x20));
  __mutex = &(pLVar2->fileobject_).mutex_;
  std::mutex::lock(__mutex);
  (pLVar2->fileobject_).base_filename_selected_ = true;
  __lhs = &(pLVar2->fileobject_).base_filename_;
  bVar1 = std::operator!=(__lhs,base_filename);
  if (bVar1) {
    if ((pLVar2->fileobject_).file_._M_t.
        super___uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_>._M_t.
        super__Tuple_impl<0UL,__IO_FILE_*,_std::default_delete<_IO_FILE>_>.
        super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl != (_IO_FILE *)0x0) {
      std::__uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_>::reset
                ((__uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_> *)
                 &(pLVar2->fileobject_).file_,(pointer)0x0);
      (pLVar2->fileobject_).rollover_attempt_ = 0x1f;
    }
    std::__cxx11::string::assign((char *)__lhs);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  pthread_mutex_unlock((pthread_mutex_t *)log_mutex);
  return;
}

Assistant:

inline void LogDestination::SetLogDestination(LogSeverity severity,
                                              const char* base_filename) {
  // Prevent any subtle race conditions by wrapping a mutex lock around
  // all this stuff.
  std::lock_guard<std::mutex> l{log_mutex};
  log_destination(severity)->fileobject_.SetBasename(base_filename);
}